

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

int Fra_ClauCheckBmc(Cla_Man_t *p,Vec_Int_t *vClause)

{
  sat_solver *s;
  int iVar1;
  int *begin;
  int *piVar2;
  int RetValue;
  int nBTLimit;
  Vec_Int_t *vClause_local;
  Cla_Man_t *p_local;
  
  s = p->pSatBmc;
  begin = Vec_IntArray(vClause);
  piVar2 = Vec_IntArray(vClause);
  iVar1 = Vec_IntSize(vClause);
  iVar1 = sat_solver_solve(s,begin,piVar2 + iVar1,0,0,0,0);
  if (iVar1 == -1) {
    p_local._4_4_ = 1;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                    ,0x183,"int Fra_ClauCheckBmc(Cla_Man_t *, Vec_Int_t *)");
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClauCheckBmc( Cla_Man_t * p, Vec_Int_t * vClause )
{
    int nBTLimit = 0;
    int RetValue;
    RetValue = sat_solver_solve( p->pSatBmc, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause), 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    return 0;
}